

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

bool __thiscall Game::checkValidCard(Game *this,size_t playerID,Card firstCard,Card newCard)

{
  bool bVar1;
  bool bVar2;
  reference __x;
  value_type cards;
  Card local_48;
  Card local_40;
  _Vector_base<Card,_std::allocator<Card>_> local_38;
  
  local_48 = firstCard;
  local_40 = newCard;
  __x = std::
        vector<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
        ::at(&this->m_playerCards,playerID);
  std::vector<Card,_std::allocator<Card>_>::vector
            ((vector<Card,_std::allocator<Card>_> *)&local_38,__x);
  bVar1 = hasCard(this,playerID,newCard);
  if (bVar1) {
    bVar2 = Ruleset::isSameType(&this->m_rules,&local_48,&local_40);
    bVar1 = true;
    if (!bVar2) {
      bVar1 = Ruleset::containsType
                        (&this->m_rules,(vector<Card,_std::allocator<Card>_> *)&local_38,&local_48);
      bVar1 = !bVar1;
    }
  }
  else {
    bVar1 = false;
  }
  std::_Vector_base<Card,_std::allocator<Card>_>::~_Vector_base(&local_38);
  return bVar1;
}

Assistant:

bool Game::checkValidCard(size_t playerID, Card firstCard, Card newCard) {
    auto cards = m_playerCards.at(playerID);
    //Card available?
    if (!hasCard(playerID, newCard)) return false;
    //served ?
    if (m_rules.isSameType(firstCard, newCard)) return true;
        //no need to serve?
    else if (m_rules.containsType(cards, firstCard)) return false;
    return true;
}